

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZStack<int,_10>,_10>::Resize
          (TPZManVector<TPZStack<int,_10>,_10> *this,int64_t newsize)

{
  TPZStack<int,_10> *pTVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  ulong uVar4;
  ulong *puVar5;
  int64_t i;
  long lVar6;
  TPZStack<int,_10> *pTVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  
  if (-1 < newsize) {
    lVar11 = (this->super_TPZVec<TPZStack<int,_10>_>).fNElements;
    if (lVar11 != newsize) {
      lVar6 = (this->super_TPZVec<TPZStack<int,_10>_>).fNAlloc;
      if (lVar6 < newsize) {
        if ((ulong)newsize < 0xb) {
          pTVar1 = this->fExtAlloc;
          if ((this->super_TPZVec<TPZStack<int,_10>_>).fStore != pTVar1) {
            lVar9 = 0;
            for (lVar6 = 0; pTVar7 = (this->super_TPZVec<TPZStack<int,_10>_>).fStore, lVar6 < lVar11
                ; lVar6 = lVar6 + 1) {
              TPZManVector<int,_10>::operator=
                        ((TPZManVector<int,_10> *)
                         ((long)(pTVar1->super_TPZManVector<int,_10>).fExtAlloc + lVar9 + -0x20),
                         (TPZManVector<int,_10> *)
                         ((long)(pTVar7->super_TPZManVector<int,_10>).fExtAlloc + lVar9 + -0x20));
              lVar11 = (this->super_TPZVec<TPZStack<int,_10>_>).fNElements;
              lVar9 = lVar9 + 0x48;
            }
            if (pTVar7 != (TPZStack<int,_10> *)0x0) {
              lVar11 = *(long *)(pTVar7[-1].super_TPZManVector<int,_10>.fExtAlloc + 8);
              if (lVar11 != 0) {
                lVar6 = lVar11 * 0x48;
                do {
                  TPZManVector<int,_10>::~TPZManVector
                            ((TPZManVector<int,_10> *)
                             ((long)pTVar7[-1].super_TPZManVector<int,_10>.fExtAlloc + lVar6 + -0x20
                             ));
                  lVar6 = lVar6 + -0x48;
                } while (lVar6 != 0);
              }
              operator_delete__(pTVar7[-1].super_TPZManVector<int,_10>.fExtAlloc + 8,
                                lVar11 * 0x48 + 8);
            }
            (this->super_TPZVec<TPZStack<int,_10>_>).fStore = pTVar1;
          }
          (this->super_TPZVec<TPZStack<int,_10>_>).fNElements = newsize;
          (this->super_TPZVec<TPZStack<int,_10>_>).fNAlloc = 0;
        }
        else {
          dVar12 = (double)lVar6 * 1.2;
          uVar10 = (long)dVar12;
          if (dVar12 < (double)newsize) {
            uVar10 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar10;
          uVar4 = SUB168(auVar2 * ZEXT816(0x48),0);
          uVar8 = uVar4 + 8;
          if (0xfffffffffffffff7 < uVar4) {
            uVar8 = 0xffffffffffffffff;
          }
          if (SUB168(auVar2 * ZEXT816(0x48),8) != 0) {
            uVar8 = 0xffffffffffffffff;
          }
          puVar5 = (ulong *)operator_new__(uVar8);
          *puVar5 = uVar10;
          pTVar1 = (TPZStack<int,_10> *)(puVar5 + 1);
          if (uVar10 != 0) {
            lVar11 = 0;
            pTVar7 = pTVar1;
            do {
              TPZStack<int,_10>::TPZStack(pTVar7);
              lVar11 = lVar11 + -0x48;
              pTVar7 = pTVar7 + 1;
            } while (uVar10 * -0x48 - lVar11 != 0);
          }
          lVar6 = 0;
          for (lVar11 = 0; pTVar7 = (this->super_TPZVec<TPZStack<int,_10>_>).fStore,
              lVar11 < (this->super_TPZVec<TPZStack<int,_10>_>).fNElements; lVar11 = lVar11 + 1) {
            TPZManVector<int,_10>::operator=
                      ((TPZManVector<int,_10> *)
                       ((long)(pTVar1->super_TPZManVector<int,_10>).fExtAlloc + lVar6 + -0x20),
                       (TPZManVector<int,_10> *)
                       ((long)(pTVar7->super_TPZManVector<int,_10>).fExtAlloc + lVar6 + -0x20));
            lVar6 = lVar6 + 0x48;
          }
          if (pTVar7 != (TPZStack<int,_10> *)0x0 && pTVar7 != this->fExtAlloc) {
            lVar11 = *(long *)(pTVar7[-1].super_TPZManVector<int,_10>.fExtAlloc + 8);
            if (lVar11 != 0) {
              lVar6 = lVar11 * 0x48;
              do {
                TPZManVector<int,_10>::~TPZManVector
                          ((TPZManVector<int,_10> *)
                           ((long)pTVar7[-1].super_TPZManVector<int,_10>.fExtAlloc + lVar6 + -0x20))
                ;
                lVar6 = lVar6 + -0x48;
              } while (lVar6 != 0);
            }
            operator_delete__(pTVar7[-1].super_TPZManVector<int,_10>.fExtAlloc + 8,lVar11 * 0x48 + 8
                             );
          }
          (this->super_TPZVec<TPZStack<int,_10>_>).fStore = pTVar1;
          (this->super_TPZVec<TPZStack<int,_10>_>).fNElements = newsize;
          (this->super_TPZVec<TPZStack<int,_10>_>).fNAlloc = uVar10;
        }
      }
      else {
        (this->super_TPZVec<TPZStack<int,_10>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}